

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
consistentStringProperty
          (pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,string *lhs,string *rhs)

{
  string local_48;
  bool local_21;
  string *psStack_20;
  bool b;
  string *rhs_local;
  string *lhs_local;
  
  psStack_20 = rhs;
  rhs_local = lhs;
  lhs_local = (string *)__return_storage_ptr__;
  local_21 = std::operator==(lhs,rhs);
  if (local_21) {
    std::__cxx11::string::string((string *)&local_48,(string *)rhs_local);
  }
  else {
    valueAsString<decltype(nullptr)>(&local_48,(nullptr_t)0x0);
  }
  std::make_pair<bool_const&,std::__cxx11::string_const>(__return_storage_ptr__,&local_21,&local_48)
  ;
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::pair<bool, std::string> consistentStringProperty(const std::string& lhs,
                                                      const std::string& rhs)
{
  const bool b = lhs == rhs;
  return std::make_pair(b, b ? lhs : valueAsString(nullptr));
}